

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_tree_element_base
              (nk_context *ctx,nk_tree_type type,nk_image *img,char *title,
              nk_collapse_states initial_state,nk_bool *selected,char *hash,int len,int line)

{
  nk_style_selectable *style;
  int *piVar1;
  nk_vec2 nVar2;
  nk_window *pnVar3;
  nk_panel *pnVar4;
  nk_panel *pnVar5;
  nk_user_font *pnVar6;
  nk_rect r;
  nk_rect rect;
  undefined8 uVar7;
  nk_hash name;
  nk_widget_layout_states nVar8;
  nk_bool nVar9;
  int iVar10;
  nk_table *pnVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  nk_context *in;
  nk_uint *unaff_R13;
  long lVar18;
  nk_window *win;
  nk_command_buffer *b;
  bool bVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  nk_rect rect_00;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_flags local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  nk_flags ws;
  nk_rect header;
  nk_panel *layout;
  float local_78;
  float fStack_74;
  
  pnVar3 = ctx->current;
  if (hash == (char *)0x0) {
    lVar18 = 0;
    if ((title != (char *)0x0) && (*title != '\0')) {
      lVar18 = 0;
      do {
        lVar14 = lVar18 + 1;
        lVar18 = lVar18 + 1;
      } while (title[lVar14] != '\0');
    }
    len = (int)lVar18;
    hash = title;
  }
  name = nk_murmur_hash(hash,len,line);
  pnVar11 = pnVar3->tables;
  do {
    if (pnVar11 == (nk_table *)0x0) {
      unaff_R13 = (nk_uint *)0x0;
      break;
    }
    uVar15 = (ulong)pnVar11->size;
    bVar19 = uVar15 != 0;
    if (uVar15 == 0) {
LAB_0011e3f1:
      pnVar11 = pnVar11->next;
    }
    else {
      if (pnVar11->keys[0] == name) {
        bVar19 = true;
        uVar16 = 0;
      }
      else {
        uVar13 = 0;
        do {
          if (uVar15 - 1 == uVar13) {
            bVar19 = uVar13 + 1 < uVar15;
            goto LAB_0011e3f1;
          }
          uVar16 = uVar13 + 1;
          lVar18 = uVar13 + 1;
          uVar13 = uVar16;
        } while (pnVar11->keys[lVar18] != name);
        bVar19 = uVar16 < uVar15;
      }
      pnVar11->seq = pnVar3->seq;
      unaff_R13 = pnVar11->values + uVar16;
    }
  } while (!bVar19);
  if (unaff_R13 == (nk_uint *)0x0) {
    unaff_R13 = nk_add_value(ctx,pnVar3,name,(nk_uint)pnVar11);
    *unaff_R13 = initial_state;
  }
  lVar18 = 0;
  if ((title != (char *)0x0) && (lVar18 = 0, *title != '\0')) {
    lVar18 = 0;
    do {
      lVar14 = lVar18 + 1;
      lVar18 = lVar18 + 1;
    } while (title[lVar14] != '\0');
  }
  header.x = 0.0;
  header.y = 0.0;
  header.w = 0.0;
  header.h = 0.0;
  ws = 0;
  iVar10 = 0;
  if (((ctx != (nk_context *)0x0) && (pnVar3 = ctx->current, iVar10 = 0, pnVar3 != (nk_window *)0x0)
      ) && (pnVar4 = pnVar3->layout, pnVar4 != (nk_panel *)0x0)) {
    local_b8 = (ctx->style).window.spacing.x;
    local_b4 = (ctx->style).window.spacing.y;
    local_b0 = (ctx->style).selectable.padding.x;
    fVar20 = (ctx->style).tab.padding.y;
    fVar20 = fVar20 + fVar20 + ((ctx->style).font)->height;
    (pnVar4->row).min_height = fVar20;
    nk_row_layout(ctx,NK_DYNAMIC,fVar20,1,0);
    if ((ctx->current != (nk_window *)0x0) &&
       (pnVar5 = ctx->current->layout, pnVar5 != (nk_panel *)0x0)) {
      fVar20 = ((ctx->style).font)->height;
      (pnVar5->row).min_height = fVar20;
      fVar22 = (ctx->style).text.padding.y;
      fVar20 = fVar22 + fVar22 + fVar20;
      (pnVar5->row).min_height = fVar20;
      fVar22 = (ctx->style).window.min_row_height_padding;
      (pnVar5->row).min_height = fVar22 + fVar22 + fVar20;
    }
    b = &pnVar3->buffer;
    nVar8 = nk_widget(&header,ctx);
    fVar22 = header.h;
    fVar20 = header.w;
    uVar7 = header._0_8_;
    if (type == NK_TREE_TAB) {
      rect.w = header.w;
      rect.x = header.x;
      rect.y = header.y;
      rect.h = header.h;
      r.w = header.w;
      r.x = header.x;
      r.y = header.y;
      r.h = header.h;
      if ((ctx->style).tab.background.type == NK_STYLE_ITEM_IMAGE) {
        nk_draw_image(b,r,&(ctx->style).tab.background.data.image,(nk_color)0xffffffff);
      }
      else {
        nk_fill_rect(b,rect,0.0,(ctx->style).tab.border_color);
        fVar25 = (ctx->style).tab.border;
        local_78 = (float)uVar7;
        fStack_74 = SUB84(uVar7,4);
        rect_00.x = fVar25 + local_78;
        rect_00.y = fVar25 + fStack_74;
        fVar25 = fVar25 + fVar25;
        auVar23._4_4_ = fVar25;
        auVar23._0_4_ = fVar25;
        auVar23._8_4_ = fVar25;
        auVar23._12_4_ = fVar25;
        auVar24._4_4_ = fVar22;
        auVar24._0_4_ = fVar20;
        auVar24._8_8_ = 0;
        auVar24 = maxps(auVar23,auVar24);
        rect_00.w = auVar24._0_4_ - fVar25;
        rect_00.h = auVar24._4_4_ - fVar25;
        nk_fill_rect(b,rect_00,(ctx->style).tab.rounding,(ctx->style).tab.background.data.color);
      }
    }
    lVar14 = 0;
    in = (nk_context *)0x0;
    if (nVar8 == NK_WIDGET_VALID && (pnVar4->flags & 0x1000) == 0) {
      in = ctx;
    }
    lVar12 = 0x1928;
    if (type == NK_TREE_TAB) {
      lVar12 = 0x17c8;
    }
    lVar17 = 0x19d8;
    if (type == NK_TREE_TAB) {
      lVar17 = 0x1878;
    }
    if (*unaff_R13 == 1) {
      lVar17 = lVar12;
    }
    pnVar6 = (ctx->style).font;
    fVar20 = pnVar6->height;
    nVar2 = (ctx->style).tab.padding;
    fVar22 = header.x;
    bounds.x = nVar2.x + fVar22;
    bounds.y = nVar2.y + header.y;
    bounds.h = fVar20;
    bounds.w = fVar20;
    nVar9 = nk_do_button_symbol(&ws,b,bounds,(&(ctx->style).tab.sym_minimize)[*unaff_R13 == 1],
                                NK_BUTTON_DEFAULT,
                                (nk_style_button *)
                                ((long)&(ctx->input).keyboard.keys[0].down + lVar17),&in->input,
                                pnVar6);
    if (nVar9 != 0) {
      *unaff_R13 = (uint)(*unaff_R13 != 1);
    }
    local_bc = 0;
    if ((title != (char *)0x0) && (*title != '\0')) {
      lVar14 = 0;
      do {
        lVar12 = lVar14 + 1;
        lVar14 = lVar14 + 1;
      } while (title[lVar12] != '\0');
    }
    style = &(ctx->style).selectable;
    pnVar6 = (ctx->style).font;
    fVar21 = (*pnVar6->width)(pnVar6->userdata,pnVar6->height,title,(int)lVar14);
    fVar21 = local_b0 * 4.0 + fVar21;
    fVar25 = local_b8 + fVar20;
    if (local_b8 + fVar20 <= header.w) {
      fVar25 = header.w;
    }
    fVar26 = fVar20 + bounds.x + local_b8;
    fVar20 = fVar25 - (local_b4 + fVar20 + (ctx->style).tab.indent);
    if (fVar21 <= fVar20) {
      fVar20 = fVar21;
    }
    pnVar6 = (ctx->style).font;
    header.w = fVar25;
    if (img == (nk_image *)0x0) {
      bounds_00.y = bounds.y;
      bounds_00.x = fVar26;
      bounds_00.w = fVar20;
      bounds_00.h = pnVar6->height;
      nk_do_selectable(&local_bc,b,bounds_00,title,(int)lVar18,0x11,selected,style,&in->input,pnVar6
                      );
    }
    else {
      nk_do_selectable_image
                (&local_bc,b,
                 (nk_rect)CONCAT88(CONCAT44(pnVar6->height,fVar20),CONCAT44(bounds.y,fVar26)),title,
                 (int)lVar18,0x11,selected,img,style,&in->input,pnVar6);
    }
    iVar10 = 0;
    if (*unaff_R13 == 1) {
      fVar20 = (ctx->style).tab.indent;
      pnVar4->at_x = fVar22 + (float)*pnVar4->offset_x + fVar20;
      fVar22 = (pnVar4->bounds).w;
      fVar25 = fVar20;
      if (fVar20 <= fVar22) {
        fVar25 = fVar22;
      }
      (pnVar4->bounds).w = fVar25;
      (pnVar4->bounds).w = fVar25 - (fVar20 + (ctx->style).window.padding.x);
      piVar1 = &(pnVar4->row).tree_depth;
      *piVar1 = *piVar1 + 1;
      iVar10 = 1;
    }
  }
  return iVar10;
}

Assistant:

NK_INTERN int
nk_tree_element_base(struct nk_context *ctx, enum nk_tree_type type,
struct nk_image *img, const char *title, enum nk_collapse_states initial_state,
nk_bool *selected, const char *hash, int len, int line)
{
struct nk_window *win = ctx->current;
int title_len = 0;
nk_hash tree_hash = 0;
nk_uint *state = 0;

/* retrieve tree state from internal widget state tables */
if (!hash) {
title_len = (int)nk_strlen(title);
tree_hash = nk_murmur_hash(title, (int)title_len, (nk_hash)line);
} else tree_hash = nk_murmur_hash(hash, len, (nk_hash)line);
state = nk_find_value(win, tree_hash);
if (!state) {
state = nk_add_value(ctx, win, tree_hash, 0);
*state = initial_state;
} return nk_tree_element_image_push_hashed_base(ctx, type, img, title,
nk_strlen(title), (enum nk_collapse_states*)state, selected);
}